

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateProfiledNewScObjArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef,uint32 length,LabelInstr *labelDone,bool isNoArgs)

{
  ushort uVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  byte bVar7;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  LabelInstr *helperLabel;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  AddrOpnd *pAVar10;
  IndirOpnd *pIVar11;
  RegOpnd *pRVar12;
  IntConstOpnd *pIVar13;
  intptr_t pMemLoc;
  MemRefOpnd *src;
  ArrayCallSiteInfo *arrayInfo_00;
  ArrayCallSiteInfo *arrayInfo_01;
  uint uVar14;
  int iVar15;
  uint32 local_38;
  bool local_31;
  uint32 size;
  bool isZeroed;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015a4e90,ArrayCtorFastPathPhase,sourceContextId,functionId);
  if (bVar4) goto LAB_005c341c;
  pFVar2 = this->m_func;
  helperLabel = IR::LabelInstr::New(Label,pFVar2,true);
  local_31 = false;
  pRVar9 = (RegOpnd *)instr->m_dst;
  local_38 = length;
  OVar5 = IR::Opnd::GetKind((Opnd *)pRVar9);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005c366e;
    *puVar8 = 0;
  }
  if (instr->m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar6) {
LAB_005c366e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  if (arrayInfo == (ArrayCallSiteInfo *)0x0) {
    arrayInfo = (ArrayCallSiteInfo *)0x0;
LAB_005c3379:
    pRVar9 = GenerateArrayAllocHelper<Js::JavascriptArray>
                       (this,instr,&local_38,arrayInfo,&local_31,true,isNoArgs);
    if (local_38 != 0) {
      uVar14 = 0;
      iVar15 = 0x18;
      do {
        pAVar10 = IR::AddrOpnd::New(&DAT_40002fff80002,AddrOpndKindConstantAddress,this->m_func,true
                                    ,(Var)0x0);
        pIVar11 = IR::IndirOpnd::New(pRVar9,iVar15,(pAVar10->super_Opnd).m_type,this->m_func,false);
        InsertMove(&pIVar11->super_Opnd,&pAVar10->super_Opnd,instr,true);
        uVar14 = uVar14 + 1;
        iVar15 = iVar15 + 8;
      } while (uVar14 < local_38);
    }
  }
  else {
    uVar1 = *(ushort *)&instr[1]._vptr_Instr;
    bVar7 = (arrayInfo->field_0).bits;
    if ((bVar7 & 1) == 0) {
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
      if (bVar6) {
        bVar7 = (arrayInfo->field_0).bits;
        goto LAB_005c3328;
      }
      GenerateArrayInfoIsNativeIntArrayTest(this,instr,arrayInfo_00,arrayInfoAddr,helperLabel);
      pRVar12 = GenerateArrayAllocHelper<Js::JavascriptNativeIntArray>
                          (this,instr,&local_38,arrayInfo,&local_31,true,isNoArgs);
      pIVar13 = IR::IntConstOpnd::New((ulong)uVar1,TyUint16,pFVar2,true);
      uVar14 = 0;
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x1a,(pIVar13->super_Opnd).m_type,this->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pIVar13->super_Opnd,instr,true);
      pAVar10 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                  false,(Var)0x0);
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x38,(pAVar10->super_Opnd).m_type,this->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pAVar10->super_Opnd,instr,true);
      if (local_38 != 0) {
        iVar15 = 0x18;
        do {
          GenerateMemInit(this,pRVar12,iVar15,-0x7fffe,instr,local_31);
          uVar14 = uVar14 + 1;
          iVar15 = iVar15 + 4;
        } while (uVar14 < local_38);
      }
    }
    else {
LAB_005c3328:
      if (((bVar7 & 2) != 0) ||
         (bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar6))
      goto LAB_005c3379;
      GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                (this,instr,arrayInfo_01,arrayInfoAddr,helperLabel);
      pRVar12 = GenerateArrayAllocHelper<Js::JavascriptNativeFloatArray>
                          (this,instr,&local_38,arrayInfo,&local_31,true,isNoArgs);
      pIVar13 = IR::IntConstOpnd::New((ulong)uVar1,TyUint16,pFVar2,true);
      uVar14 = 0;
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x1a,(pIVar13->super_Opnd).m_type,this->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pIVar13->super_Opnd,instr,true);
      pAVar10 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                  false,(Var)0x0);
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x38,(pAVar10->super_Opnd).m_type,this->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pAVar10->super_Opnd,instr,true);
      if (local_38 != 0) {
        iVar15 = 0x18;
        do {
          pFVar2 = this->m_func;
          pMemLoc = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr
                              (pFVar2->m_threadContextInfo);
          src = IR::MemRefOpnd::New(pMemLoc,TyFloat64,pFVar2,AddrOpndKindDynamicMisc);
          pIVar11 = IR::IndirOpnd::New(pRVar12,iVar15,(src->super_Opnd).m_type,this->m_func,false);
          InsertMove(&pIVar11->super_Opnd,&src->super_Opnd,instr,true);
          uVar14 = uVar14 + 1;
          iVar15 = iVar15 + 8;
        } while (uVar14 < local_38);
      }
    }
  }
  InsertBranch(Br,false,labelDone,instr);
  IR::Instr::InsertBefore(instr,&helperLabel->super_Instr);
LAB_005c341c:
  return !bVar4;
}

Assistant:

bool
Lowerer::GenerateProfiledNewScObjArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef, uint32 length, IR::LabelInstr* labelDone, bool isNoArgs)
{
    if (PHASE_OFF(Js::ArrayCtorFastPathPhase, m_func))
    {
        return false;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    uint32 size = length;
    bool isZeroed = false;
    IR::RegOpnd *dstOpnd = instr->GetDst()->AsRegOpnd();
    IR::RegOpnd *headOpnd;
    Js::ProfileId profileId = static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId);
    if (arrayInfo && arrayInfo->IsNativeIntArray())
    {
        GenerateArrayInfoIsNativeIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeIntArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptNativeIntArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfArrayCallSiteIndex(), IR::IntConstOpnd::New(profileId, TyUint16, func, true), instr, isZeroed);
        GenerateMemInit(dstOpnd, Js::JavascriptNativeIntArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);
        for (uint i = 0; i < size; i++)
        {
            GenerateMemInit(headOpnd, sizeof(Js::SparseArraySegmentBase) + i * sizeof(int32),
                            Js::JavascriptNativeIntArray::MissingItem, instr, isZeroed);
        }
    }
    else if (arrayInfo && arrayInfo->IsNativeFloatArray())
    {
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);
        Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);

        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex(), IR::IntConstOpnd::New(profileId, TyUint16, func, true), instr, isZeroed);
        GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isZeroed);

        // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        for (uint i = 0; i < size; i++)
        {
            GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(double),
                GetMissingItemOpndForAssignment(TyFloat64, m_func),
                instr, isZeroed);
        }
    }
    else
    {
        uint const offsetStart = sizeof(Js::SparseArraySegmentBase);
        headOpnd = GenerateArrayObjectsAlloc<Js::JavascriptArray>(instr, &size, arrayInfo, &isZeroed, isNoArgs);
        for (uint i = 0; i < size; i++)
        {
             GenerateMemInit(
                headOpnd, offsetStart + i * sizeof(Js::Var),
                GetMissingItemOpndForAssignment(TyVar, m_func),
                instr, isZeroed);
        }
    }

    // Skip pass the helper call
    InsertBranch(Js::OpCode::Br, labelDone, instr);
    instr->InsertBefore(helperLabel);
    return true;
}